

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guild.cpp
# Opt level: O0

Guild_Member * __thiscall Guild_Create::GetMember(Guild_Create *this,string *character)

{
  bool bVar1;
  __type _Var2;
  reference psVar3;
  element_type *__rhs;
  undefined1 local_68 [8];
  shared_ptr<Guild_Member> check;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_> *__range1;
  string *local_20;
  string *character_local;
  Guild_Create *this_local;
  
  local_20 = character;
  character_local = (string *)this;
  util::lowercase((string *)&__range1,character);
  std::__cxx11::string::operator=((string *)character,(string *)&__range1);
  std::__cxx11::string::~string((string *)&__range1);
  __end1 = std::
           vector<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>::
           begin(&this->members);
  check.super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::vector<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>::
       end(&this->members);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<Guild_Member>_*,_std::vector<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>_>
                                *)&check.
                                   super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
    if (!bVar1) {
      return (Guild_Member *)0x0;
    }
    psVar3 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<Guild_Member>_*,_std::vector<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>_>
             ::operator*(&__end1);
    std::shared_ptr<Guild_Member>::shared_ptr((shared_ptr<Guild_Member> *)local_68,psVar3);
    __rhs = std::__shared_ptr_access<Guild_Member,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Guild_Member,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_68);
    _Var2 = std::operator==(character,&__rhs->name);
    if (_Var2) {
      this_local = (Guild_Create *)
                   std::__shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>::get
                             ((__shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2> *)local_68);
    }
    std::shared_ptr<Guild_Member>::~shared_ptr((shared_ptr<Guild_Member> *)local_68);
    if (_Var2) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Guild_Member>_*,_std::vector<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>_>
    ::operator++(&__end1);
  }
  return (Guild_Member *)this_local;
}

Assistant:

Guild_Member *Guild_Create::GetMember(std::string character)
{
	character = util::lowercase(character);

	UTIL_FOREACH(this->members, check)
	{
		if (character == check->name)
		{
			return check.get();
		}
	}

	return 0;
}